

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.h
# Opt level: O3

void __thiscall spvtools::opt::SSARewriter::SSARewriter(SSARewriter *this,MemPass *pass)

{
  (this->defs_at_block_)._M_h._M_buckets = &(this->defs_at_block_)._M_h._M_single_bucket;
  (this->defs_at_block_)._M_h._M_bucket_count = 1;
  (this->defs_at_block_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->defs_at_block_)._M_h._M_element_count = 0;
  (this->defs_at_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->defs_at_block_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->defs_at_block_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->phi_candidates_)._M_h._M_buckets = &(this->phi_candidates_)._M_h._M_single_bucket;
  (this->phi_candidates_)._M_h._M_bucket_count = 1;
  (this->phi_candidates_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phi_candidates_)._M_h._M_element_count = 0;
  (this->phi_candidates_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phi_candidates_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phi_candidates_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->incomplete_phis_).c.
  super__Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ::_M_initialize_map((_Deque_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
                       *)&this->incomplete_phis_,0);
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->load_replacement_)._M_h._M_buckets = &(this->load_replacement_)._M_h._M_single_bucket;
  (this->load_replacement_)._M_h._M_bucket_count = 1;
  (this->load_replacement_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->load_replacement_)._M_h._M_element_count = 0;
  (this->load_replacement_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->load_replacement_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->load_replacement_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sealed_blocks_)._M_h._M_buckets = &(this->sealed_blocks_)._M_h._M_single_bucket;
  (this->sealed_blocks_)._M_h._M_bucket_count = 1;
  (this->sealed_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sealed_blocks_)._M_h._M_element_count = 0;
  (this->sealed_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sealed_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sealed_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->pass_ = pass;
  return;
}

Assistant:

SSARewriter(MemPass* pass) : pass_(pass) {}